

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

void __thiscall caffe::NetState::Clear(NetState *this)

{
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(this->stage_).super_RepeatedPtrFieldBase);
  if (((this->_has_bits_).has_bits_[0] & 3) != 0) {
    this->level_ = 0;
    this->phase_ = 1;
  }
  (this->_has_bits_).has_bits_[0] = 0;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadataWithArena::DoClear(&this->_internal_metadata_);
  return;
}

Assistant:

void NetState::Clear() {
// @@protoc_insertion_point(message_clear_start:caffe.NetState)
  stage_.Clear();
  if (_has_bits_[0 / 32] & 3u) {
    level_ = 0;
    phase_ = 1;
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}